

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Part.cpp
# Opt level: O3

Poly * __thiscall MT32Emu::PolyList::takeFirst(PolyList *this)

{
  Poly *this_00;
  Poly *pPVar1;
  
  this_00 = this->firstPoly;
  pPVar1 = Poly::getNext(this_00);
  this->firstPoly = pPVar1;
  if (pPVar1 == (Poly *)0x0) {
    this->lastPoly = (Poly *)0x0;
  }
  Poly::setNext(this_00,(Poly *)0x0);
  return this_00;
}

Assistant:

Poly *PolyList::takeFirst() {
	Poly *oldFirst = firstPoly;
	firstPoly = oldFirst->getNext();
	if (firstPoly == NULL) {
#ifdef MT32EMU_POLY_LIST_DEBUG
		if (lastPoly != oldFirst) {
			printf("PolyList: firstPoly != lastPoly in a list with a single Poly\n");
		}
#endif
		lastPoly = NULL;
	}
	oldFirst->setNext(NULL);
	return oldFirst;
}